

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

void __thiscall dxil_spv::Converter::Impl::emit_execution_modes_post_code_generation(Impl *this)

{
  bool bVar1;
  Builder *this_00;
  Module *module;
  Builder *this_01;
  Function *pFVar2;
  
  this_00 = builder(this);
  module = LLVMBCParser::get_module(this->bitcode_parser);
  bVar1 = module_is_dxilconv(module);
  if (bVar1) {
    this_01 = builder(this);
    bVar1 = spv::Builder::hasCapability(this_01,CapabilitySignedZeroInfNanPreserve);
    if (!bVar1) {
      spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
      spv::Builder::addCapability(this_00,CapabilitySignedZeroInfNanPreserve);
      pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
      spv::Builder::addExecutionMode
                (this_00,pFVar2,ExecutionModeSignedZeroInfNanPreserve,0x20,-1,-1);
      bVar1 = spv::Builder::hasCapability(this_00,CapabilityFloat64);
      if (bVar1) {
        pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
        spv::Builder::addExecutionMode
                  (this_00,pFVar2,ExecutionModeSignedZeroInfNanPreserve,0x40,-1,-1);
      }
    }
    bVar1 = spv::Builder::hasCapability(this_00,CapabilityDenormFlushToZero);
    if (!bVar1) {
      bVar1 = spv::Builder::hasCapability(this_00,CapabilityDenormPreserve);
      if (!bVar1) {
        spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
        spv::Builder::addCapability(this_00,CapabilityDenormFlushToZero);
        pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
        spv::Builder::addExecutionMode(this_00,pFVar2,ExecutionModeDenormFlushToZero,0x20,-1,-1);
      }
    }
  }
  bVar1 = spv::Builder::hasCapability(this_00,CapabilityFloat16);
  if ((bVar1) && ((this->options).supports_float16_denorm_preserve == true)) {
    spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
    spv::Builder::addCapability(this_00,CapabilityDenormPreserve);
    pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar2,ExecutionModeDenormPreserve,0x10,-1,-1);
  }
  bVar1 = spv::Builder::hasCapability(this_00,CapabilityFloat64);
  if ((bVar1) && ((this->options).supports_float64_denorm_preserve == true)) {
    spv::Builder::addExtension(this_00,"SPV_KHR_float_controls");
    spv::Builder::addCapability(this_00,CapabilityDenormPreserve);
    pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar2,ExecutionModeDenormPreserve,0x40,-1,-1);
  }
  if ((((this->options).supports_quad_control == true) &&
      (this->execution_model == ExecutionModelFragment)) &&
     ((this->execution_mode_meta).needs_quad_derivatives == true)) {
    spv::Builder::addExtension(this_00,"SPV_KHR_quad_control");
    spv::Builder::addCapability(this_00,CapabilityQuadControlKHR);
    pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar2,ExecutionModeRequireFullQuadsKHR,-1,-1,-1);
    pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar2,ExecutionModeQuadDerivativesKHR,-1,-1,-1);
  }
  if (((this->options).supports_maximal_reconvergence == true) &&
     ((((this->options).force_maximal_reconvergence != false ||
       ((this->execution_mode_meta).waveops_include_helper_lanes != false)) ||
      (((this->execution_mode_meta).needs_quad_derivatives != false ||
       ((this->shader_analysis).need_maximal_reconvergence_helper_call == true)))))) {
    spv::Builder::addExtension(this_00,"SPV_KHR_maximal_reconvergence");
    pFVar2 = SPIRVModule::get_entry_function(this->spirv_module);
    spv::Builder::addExecutionMode(this_00,pFVar2,ExecutionModeMaximallyReconvergesKHR,-1,-1,-1);
    return;
  }
  return;
}

Assistant:

void Converter::Impl::emit_execution_modes_post_code_generation()
{
	auto &b = builder();

	if (module_is_dxilconv(bitcode_parser.get_module()))
	{
		// We should use these globally, but don't want to invalidate all Fossilize archives just yet.
		// Shader instrumentation may declare its own preservation modes, so only declare execution modes
		// if we haven't done anything.
		if (!builder().hasCapability(spv::CapabilitySignedZeroInfNanPreserve))
		{
			b.addExtension("SPV_KHR_float_controls");
			b.addCapability(spv::CapabilitySignedZeroInfNanPreserve);
			b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeSignedZeroInfNanPreserve, 32);
			if (b.hasCapability(spv::CapabilityFloat64))
				b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeSignedZeroInfNanPreserve, 64);
		}

		// DXBC assumes flush-to-zero, but dxilconv doesn't explicitly emit that, since it's not in SM 6.0.
		if (!b.hasCapability(spv::CapabilityDenormFlushToZero) && !b.hasCapability(spv::CapabilityDenormPreserve))
		{
			b.addExtension("SPV_KHR_float_controls");
			b.addCapability(spv::CapabilityDenormFlushToZero);
			b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormFlushToZero, 32);
		}
	}

	// Float16 and Float64 require denorms to be preserved in D3D12.
	if (b.hasCapability(spv::CapabilityFloat16) &&
	    options.supports_float16_denorm_preserve)
	{
		b.addExtension("SPV_KHR_float_controls");
		b.addCapability(spv::CapabilityDenormPreserve);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 16);
	}

	if (b.hasCapability(spv::CapabilityFloat64) &&
	    options.supports_float64_denorm_preserve)
	{
		b.addExtension("SPV_KHR_float_controls");
		b.addCapability(spv::CapabilityDenormPreserve);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeDenormPreserve, 64);
	}

	// Opt into quad derivatives and maximal reconvergence for fragment shaders using
	// QuadAll/QuadAny intrinsics to get meaningful behaviour for quad-uniform control
	// flow, other quad ops are ignored for now.
	if (options.supports_quad_control && execution_model == spv::ExecutionModelFragment &&
	    execution_mode_meta.needs_quad_derivatives)
	{
		b.addExtension("SPV_KHR_quad_control");
		b.addCapability(spv::CapabilityQuadControlKHR);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeRequireFullQuadsKHR);
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeQuadDerivativesKHR);
	}

	if (options.supports_maximal_reconvergence &&
	    (options.force_maximal_reconvergence ||
	     execution_mode_meta.waveops_include_helper_lanes ||
	     execution_mode_meta.needs_quad_derivatives ||
	     shader_analysis.need_maximal_reconvergence_helper_call))
	{
		b.addExtension("SPV_KHR_maximal_reconvergence");
		b.addExecutionMode(spirv_module.get_entry_function(), spv::ExecutionModeMaximallyReconvergesKHR);
	}
}